

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

void __thiscall
BuildWithQueryDepsLogTest::~BuildWithQueryDepsLogTest(BuildWithQueryDepsLogTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_BuildTest).super_StateTestWithBuiltinRules.super_Test._vptr_Test =
       (_func_int **)&PTR__BuildWithQueryDepsLogTest_001f7b40;
  (this->super_BuildTest).super_BuildLogUser._vptr_BuildLogUser = (_func_int **)&DAT_001f7b80;
  DepsLog::Close(&this->log_);
  DepsLog::~DepsLog(&this->log_);
  pcVar2 = (this->temp_dir_).temp_dir_name_._M_dataplus._M_p;
  paVar1 = &(this->temp_dir_).temp_dir_name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->temp_dir_).start_dir_._M_dataplus._M_p;
  paVar1 = &(this->temp_dir_).start_dir_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  BuildTest::~BuildTest(&this->super_BuildTest);
  return;
}

Assistant:

~BuildWithQueryDepsLogTest() {
    log_.Close();
  }